

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_export.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,ExportStatement *stmt)

{
  ClientContext *context;
  TableCatalogEntry *table;
  pointer puVar1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var3;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var4;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var5;
  CopyFunctionCatalogEntry *pCVar6;
  element_type *peVar7;
  pointer prVar8;
  _Alloc_hider _Var9;
  pointer ppVar10;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> uVar11;
  int iVar12;
  pointer pCVar13;
  CopyFunctionCatalogEntry *pCVar14;
  pointer pCVar15;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar16;
  pointer pCVar17;
  NotNullConstraint *pNVar18;
  ColumnDefinition *pCVar19;
  ColumnList *this_00;
  string *__a;
  LogicalType *__b;
  pointer pBVar20;
  pointer pBVar21;
  pointer pSVar22;
  Binder *this_01;
  pointer pLVar23;
  StatementProperties *pSVar24;
  NotImplementedException *this_02;
  pointer prVar25;
  pointer *__ptr;
  pointer prVar26;
  unsigned_long __val;
  pointer this_03;
  pointer args;
  __ireturn_type _Var27;
  ColumnListIterator CVar28;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  __uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_> local_458;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_450;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *local_448;
  optional_ptr<duckdb::Binder,_true> local_440;
  BoundStatement *local_438;
  _Head_base<0UL,_duckdb::BoundExportData_*,_false> local_430;
  FileSystem *local_428;
  CopyFunctionCatalogEntry *local_420;
  shared_ptr<duckdb::Binder,_true> copy_binder;
  __buckets_ptr local_400;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  export_nodes;
  catalog_entry_vector_t tables;
  BoundStatement bound_statement;
  ExportedTableData exported_data;
  child_list_t<LogicalType> select_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  not_null_columns;
  string catalog;
  ExportedTableInfo table_info;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  local_1b8;
  CopyStatement copy_stmt;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table_name_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  ExportedTableData local_c8;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_440.ptr = this;
  local_438 = __return_storage_ptr__;
  LogicalType::LogicalType((LogicalType *)&exported_data,BOOLEAN);
  __l._M_len = 1;
  __l._M_array = (iterator)&exported_data;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&table_info,__l,
             (allocator_type *)&copy_stmt);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(local_438->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&table_info);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&table_info);
  LogicalType::~LogicalType((LogicalType *)&exported_data);
  ::std::__cxx11::string::string((string *)&table_info,"Success",(allocator *)&copy_stmt);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&table_info;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&exported_data,__l_00,(allocator_type *)&table_name_index);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_438->names,&exported_data);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&exported_data);
  ::std::__cxx11::string::~string((string *)&table_info);
  context = (local_440.ptr)->context;
  ::std::__cxx11::string::string
            ((string *)&table_info,anon_var_dwarf_4b71df5 + 9,(allocator *)&copy_stmt);
  ::std::__cxx11::string::string((string *)&exported_data,"main",(allocator *)&table_name_index);
  local_448 = &stmt->info;
  pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (local_448);
  pCVar14 = Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                      (context,(string *)&table_info,&exported_data.table_name,&pCVar13->format,
                       (QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::~string((string *)&exported_data);
  ::std::__cxx11::string::~string((string *)&table_info);
  if ((pCVar14->function).plan != (copy_to_plan_t)0x0 ||
      (pCVar14->function).copy_to_bind != (copy_to_bind_t)0x0) {
    if ((stmt->database)._M_string_length == 0) {
      ::std::__cxx11::string::string
                ((string *)&catalog,anon_var_dwarf_4b71df5 + 9,(allocator *)&table_info);
    }
    else {
      ::std::__cxx11::string::string((string *)&catalog,(string *)&stmt->database);
    }
    tables.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tables.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tables.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Catalog::GetSchemas(&schemas,(local_440.ptr)->context,&catalog);
    local_420 = pCVar14;
    for (prVar26 = schemas.
                   super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        prVar26 !=
        schemas.
        super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; prVar26 = prVar26 + 1) {
      table_info.table_data.table_name._M_dataplus._M_p = (pointer)0x0;
      table_info.entry = (TableCatalogEntry *)&tables;
      table_info.table_data.table_name.field_2._M_allocated_capacity =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_export.cpp:178:56)>
           ::_M_invoke;
      table_info.table_data.table_name._M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_export.cpp:178:56)>
           ::_M_manager;
      (*(prVar26->_M_data->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (prVar26->_M_data,(local_440.ptr)->context,1,&table_info);
      ::std::_Function_base::~_Function_base((_Function_base *)&table_info);
    }
    ReorderTableEntries(&tables);
    local_428 = FileSystem::GetFileSystem((local_440.ptr)->context);
    pCVar6 = local_420;
    make_uniq<duckdb::BoundExportData>();
    prVar8 = tables.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    table_name_index._M_h._M_buckets = &table_name_index._M_h._M_single_bucket;
    table_name_index._M_h._M_bucket_count = 1;
    table_name_index._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    table_name_index._M_h._M_element_count = 0;
    table_name_index._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    table_name_index._M_h._M_rehash_policy._M_next_resize = 0;
    table_name_index._M_h._M_single_bucket = (__node_base_ptr)0x0;
    export_nodes.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    export_nodes.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    export_nodes.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_420 = (CopyFunctionCatalogEntry *)&(pCVar6->function).extension;
    for (prVar25 = tables.
                   super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; prVar25 != prVar8;
        prVar25 = prVar25 + 1) {
      table = (TableCatalogEntry *)prVar25->_M_data;
      make_uniq<duckdb::CopyInfo>();
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (local_448);
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_458);
      ::std::__cxx11::string::_M_assign((string *)&pCVar13->format);
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->(local_448);
      pCVar15 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_458);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::operator=(&(pCVar15->options)._M_h,&(pCVar13->options)._M_h);
      __val = 0;
      do {
        if (__val == 0) {
          table_info.entry = (TableCatalogEntry *)&table_info.table_data.table_name._M_string_length
          ;
          table_info.table_data.table_name._M_dataplus._M_p = (pointer)0x0;
          table_info.table_data.table_name._M_string_length =
               table_info.table_data.table_name._M_string_length & 0xffffffffffffff00;
        }
        else {
          ::std::__cxx11::to_string(&exported_data.table_name,__val);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &table_info,"_",&exported_data.table_name);
          ::std::__cxx11::string::~string((string *)&exported_data);
        }
        CreateFileName(&exported_data.table_name,(string *)&table_info,table,(string *)local_420);
        pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->(local_448);
        ::std::__cxx11::string::string((string *)&copy_stmt,(string *)&pCVar13->file_path);
        FileSystem::JoinPath
                  ((string *)&bound_statement,local_428,(string *)&copy_stmt,
                   &exported_data.table_name);
        pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                              *)&local_458);
        ::std::__cxx11::string::_M_assign((string *)&pCVar13->file_path);
        pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                              *)&local_458);
        _Var27 = ::std::__detail::
                 _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)&table_name_index,&pCVar13->file_path);
        __val = __val + 1;
        ::std::__cxx11::string::~string((string *)&bound_statement);
        ::std::__cxx11::string::~string((string *)&copy_stmt);
        ::std::__cxx11::string::~string((string *)&exported_data);
        ::std::__cxx11::string::~string((string *)&table_info);
      } while (((undefined1  [16])_Var27 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_458);
      pCVar13->is_from = false;
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_458);
      ::std::__cxx11::string::_M_assign((string *)&pCVar13->catalog);
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_458);
      ::std::__cxx11::string::_M_assign((string *)&pCVar13->schema);
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_458);
      ::std::__cxx11::string::_M_assign((string *)&pCVar13->table);
      select_list.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      select_list.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      select_list.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      not_null_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      not_null_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      not_null_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar16 = TableCatalogEntry::GetConstraints(table);
      puVar1 = (pvVar16->
               super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_03 = (pvVar16->
                     super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_03 != puVar1;
          this_03 = this_03 + 1) {
        pCVar17 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->(this_03);
        if (pCVar17->type == NOT_NULL) {
          pCVar17 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_03);
          pNVar18 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar17);
          pCVar19 = TableCatalogEntry::GetColumn(table,(LogicalIndex)(pNVar18->index).index);
          ColumnDefinition::GetName_abi_cxx11_((string *)&table_info,pCVar19);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &not_null_columns,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &table_info);
          ::std::__cxx11::string::~string((string *)&table_info);
        }
      }
      this_00 = TableCatalogEntry::GetColumns(table);
      CVar28 = ColumnList::Physical(this_00);
      bound_statement.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           CVar28.list;
      bound_statement.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(bound_statement.types.
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,CVar28.physical);
      ColumnList::ColumnListIterator::begin
                ((ColumnLogicalIteratorInternal *)&exported_data,
                 (ColumnListIterator *)&bound_statement);
      ColumnList::ColumnListIterator::end
                ((ColumnLogicalIteratorInternal *)&copy_stmt,(ColumnListIterator *)&bound_statement)
      ;
      while (((exported_data.table_name.field_2._M_allocated_capacity !=
               copy_stmt.super_SQLStatement.stmt_location ||
              (exported_data.table_name.field_2._8_8_ != copy_stmt.super_SQLStatement.stmt_length))
             || ((_func_int **)exported_data.table_name._M_dataplus._M_p !=
                 copy_stmt.super_SQLStatement._vptr_SQLStatement))) {
        pCVar19 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)&exported_data);
        __a = ColumnDefinition::Name_abi_cxx11_(pCVar19);
        __b = ColumnDefinition::Type(pCVar19);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)&table_info,__a,__b);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&select_list,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)&table_info);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 *)&table_info);
        exported_data.table_name.field_2._M_allocated_capacity =
             exported_data.table_name.field_2._M_allocated_capacity + 1;
      }
      exported_data.table_name._M_dataplus._M_p = (pointer)&exported_data.table_name.field_2;
      exported_data.table_name._M_string_length = 0;
      exported_data.table_name.field_2._M_allocated_capacity =
           exported_data.table_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      exported_data.schema_name._M_dataplus._M_p = (pointer)&exported_data.schema_name.field_2;
      exported_data.schema_name._M_string_length = 0;
      exported_data.schema_name.field_2._M_local_buf[0] = '\0';
      exported_data.database_name._M_dataplus._M_p = (pointer)&exported_data.database_name.field_2;
      exported_data.database_name._M_string_length = 0;
      exported_data.database_name.field_2._M_local_buf[0] = '\0';
      exported_data.file_path._M_dataplus._M_p = (pointer)&exported_data.file_path.field_2;
      exported_data.file_path._M_string_length = 0;
      exported_data.file_path.field_2._M_local_buf[0] = '\0';
      exported_data.not_null_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      exported_data.not_null_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      exported_data.not_null_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::__cxx11::string::_M_assign((string *)&exported_data.database_name);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_458);
      ::std::__cxx11::string::_M_assign((string *)&exported_data);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_458);
      ::std::__cxx11::string::_M_assign((string *)&exported_data.schema_name);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_458);
      ::std::__cxx11::string::_M_assign((string *)&exported_data.file_path);
      ExportedTableData::ExportedTableData(&local_c8,&exported_data);
      ExportedTableInfo::ExportedTableInfo(&table_info,table,&local_c8,&not_null_columns);
      ExportedTableData::~ExportedTableData(&local_c8);
      pBVar20 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                              *)&local_430);
      ::std::vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>::
      push_back(&(pBVar20->data).
                 super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                ,&table_info);
      CopyStatement::CopyStatement(&copy_stmt);
      uVar11 = copy_stmt.info;
      copy_stmt.info.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t
      .super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
           (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
           (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
           local_458._M_t.
           super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
           super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl;
      local_458._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
           (tuple<duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>)
           (_Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>)0x0;
      if (uVar11.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
          super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
          super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0)
      {
        (**(code **)(*(long *)uVar11.
                              super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>
                              .super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl + 8))()
        ;
      }
      make_uniq<duckdb::BaseTableRef>();
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (&copy_stmt.info);
      pBVar21 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&copy_binder);
      ::std::__cxx11::string::_M_assign((string *)&pBVar21->catalog_name);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (&copy_stmt.info);
      pBVar21 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&copy_binder);
      ::std::__cxx11::string::_M_assign((string *)&pBVar21->schema_name);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (&copy_stmt.info);
      pBVar21 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&copy_binder);
      ::std::__cxx11::string::_M_assign((string *)&pBVar21->table_name);
      make_uniq<duckdb::SelectNode>();
      peVar7 = copy_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      copy_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pSVar22 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_450);
      _Var2._M_head_impl =
           (pSVar22->from_table).
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
      (pSVar22->from_table).
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)peVar7;
      if (_Var2._M_head_impl != (TableRef *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
      }
      ppVar10 = select_list.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bound_statement.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bound_statement.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      bound_statement.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      for (args = select_list.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; args != ppVar10; args = args + 1) {
        make_uniq_base<duckdb::ParsedExpression,duckdb::ColumnRefExpression,std::__cxx11::string&>
                  ((duckdb *)&local_400,&args->first);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&bound_statement,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_400);
        if (local_400 != (__buckets_ptr)0x0) {
          (*(code *)(*local_400)[1]._M_nxt)();
        }
      }
      pSVar22 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_450);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::_M_move_assign(&(pSVar22->select_list).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ,&bound_statement);
      _Var5._M_head_impl = local_450._M_head_impl;
      local_450._M_head_impl = (SelectNode *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&bound_statement);
      if (local_450._M_head_impl != (SelectNode *)0x0) {
        (*((local_450._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
      if (copy_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        (*(code *)((((copy_binder.internal.
                      super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->(&copy_stmt.info);
      _Var3._M_head_impl =
           (pCVar13->select_statement).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pCVar13->select_statement).
      super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
           &(_Var5._M_head_impl)->super_QueryNode;
      if (_Var3._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
      }
      CreateBinder((Binder *)&copy_binder,(local_440.ptr)->context,local_440,REGULAR_BINDER);
      this_01 = shared_ptr<duckdb::Binder,_true>::operator->(&copy_binder);
      Bind(&bound_statement,this_01,&copy_stmt,EXPORT_DATABASE);
      local_450._M_head_impl =
           (SelectNode *)
           bound_statement.plan.
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      bound_statement.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&export_nodes,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_450);
      if (local_450._M_head_impl != (SelectNode *)0x0) {
        (*((local_450._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
      BoundStatement::~BoundStatement(&bound_statement);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&copy_binder.internal.
                  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      CopyStatement::~CopyStatement(&copy_stmt);
      ExportedTableData::~ExportedTableData(&table_info.table_data);
      ExportedTableData::~ExportedTableData(&exported_data);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&not_null_columns);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&select_list);
      if (local_458._M_t.
          super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
          super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>)0x0) {
        (**(code **)(*(long *)local_458._M_t.
                              super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>
                              .super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl + 8))()
        ;
      }
    }
    local_1b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         export_nodes.
         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         export_nodes.
         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1b8.
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         export_nodes.
         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    export_nodes.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    export_nodes.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    export_nodes.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    UnionOperators((Binder *)&table_info,
                   (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    *)local_440.ptr);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ::~vector(&local_1b8);
    pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_448);
    iVar12 = (*local_428->_vptr_FileSystem[0xd])(local_428,&pCVar13->file_path,0);
    if ((char)iVar12 == '\0') {
      pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->(local_448);
      (*local_428->_vptr_FileSystem[0xe])(local_428,&pCVar13->file_path,0);
    }
    pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_448);
    ::std::__cxx11::string::_M_assign((string *)&pCVar13->catalog);
    make_uniq<duckdb::LogicalExport,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>,duckdb::unique_ptr<duckdb::BoundExportData,std::default_delete<duckdb::BoundExportData>,true>>
              ((duckdb *)&exported_data,&pCVar14->function,local_448,
               (unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                *)&local_430);
    if (table_info.entry != (TableCatalogEntry *)0x0) {
      pLVar23 = unique_ptr<duckdb::LogicalExport,_std::default_delete<duckdb::LogicalExport>,_true>
                ::operator->((unique_ptr<duckdb::LogicalExport,_std::default_delete<duckdb::LogicalExport>,_true>
                              *)&exported_data);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar23->super_LogicalOperator).children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&table_info);
    }
    _Var9._M_p = exported_data.table_name._M_dataplus._M_p;
    exported_data.table_name._M_dataplus._M_p = (pointer)0x0;
    _Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (local_438->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (local_438->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)_Var9._M_p;
    if (_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
    }
    pSVar24 = GetStatementProperties(local_440.ptr);
    pSVar24->allow_stream_result = false;
    pSVar24->return_type = NOTHING;
    if (exported_data.table_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)exported_data.table_name._M_dataplus._M_p + 8))();
    }
    if (table_info.entry != (TableCatalogEntry *)0x0) {
      (*((table_info.entry)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
        _vptr_CatalogEntry[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ::~vector(&export_nodes.
               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             );
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&table_name_index._M_h);
    if (local_430._M_head_impl != (BoundExportData *)0x0) {
      (*((local_430._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                     *)&schemas);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     *)&tables);
    ::std::__cxx11::string::~string((string *)&catalog);
    return local_438;
  }
  this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&table_info,"COPY TO is not supported for FORMAT \"%s\"",
             (allocator *)&exported_data);
  pCVar13 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (local_448);
  ::std::__cxx11::string::string((string *)&local_e8,(string *)&pCVar13->format);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_02,(string *)&table_info,&local_e8);
  __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::Bind(ExportStatement &stmt) {
	// COPY TO a file
	BoundStatement result;
	result.types = {LogicalType::BOOLEAN};
	result.names = {"Success"};

	// lookup the format in the catalog
	auto &copy_function =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, INVALID_CATALOG, DEFAULT_SCHEMA, stmt.info->format);
	if (!copy_function.function.copy_to_bind && !copy_function.function.plan) {
		throw NotImplementedException("COPY TO is not supported for FORMAT \"%s\"", stmt.info->format);
	}

	// gather a list of all the tables
	string catalog = stmt.database.empty() ? INVALID_CATALOG : stmt.database;
	catalog_entry_vector_t tables;
	auto schemas = Catalog::GetSchemas(context, catalog);
	for (auto &schema : schemas) {
		schema.get().Scan(context, CatalogType::TABLE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.type == CatalogType::TABLE_ENTRY) {
				tables.push_back(entry.Cast<TableCatalogEntry>());
			}
		});
	}

	// reorder tables because of foreign key constraint
	ReorderTableEntries(tables);

	// now generate the COPY statements for each of the tables
	auto &fs = FileSystem::GetFileSystem(context);

	auto exported_tables = make_uniq<BoundExportData>();

	unordered_set<string> table_name_index;
	vector<unique_ptr<LogicalOperator>> export_nodes;
	for (auto &t : tables) {
		auto &table = t.get().Cast<TableCatalogEntry>();
		auto info = make_uniq<CopyInfo>();
		// we copy the options supplied to the EXPORT
		info->format = stmt.info->format;
		info->options = stmt.info->options;
		// set up the file name for the COPY TO

		idx_t id = 0;
		while (true) {
			string id_suffix = id == 0 ? string() : "_" + to_string(id);
			auto name = CreateFileName(id_suffix, table, copy_function.function.extension);
			auto directory = stmt.info->file_path;
			auto full_path = fs.JoinPath(directory, name);
			info->file_path = full_path;
			auto insert_result = table_name_index.insert(info->file_path);
			if (insert_result.second) {
				// this name was not yet taken: take it
				break;
			}
			id++;
		}
		info->is_from = false;
		info->catalog = catalog;
		info->schema = table.schema.name;
		info->table = table.name;

		// We can not export generated columns
		child_list_t<LogicalType> select_list;
		// Let's verify if any on these columns have not null constraints
		vector<string> not_null_columns;
		for (auto &constaint : table.GetConstraints()) {
			if (constaint->type == ConstraintType::NOT_NULL) {
				auto &not_null_constraint = constaint->Cast<NotNullConstraint>();
				not_null_columns.push_back(table.GetColumn(not_null_constraint.index).GetName());
			}
		}
		for (auto &col : table.GetColumns().Physical()) {
			select_list.push_back(std::make_pair(col.Name(), col.Type()));
		}

		ExportedTableData exported_data;
		exported_data.database_name = catalog;
		exported_data.table_name = info->table;
		exported_data.schema_name = info->schema;

		exported_data.file_path = info->file_path;

		ExportedTableInfo table_info(table, std::move(exported_data), not_null_columns);
		exported_tables->data.push_back(table_info);
		id++;

		// generate the copy statement and bind it
		CopyStatement copy_stmt;
		copy_stmt.info = std::move(info);
		copy_stmt.info->select_statement = CreateSelectStatement(copy_stmt, select_list);

		auto copy_binder = Binder::CreateBinder(context, this);
		auto bound_statement = copy_binder->Bind(copy_stmt, CopyToType::EXPORT_DATABASE);

		auto plan = std::move(bound_statement.plan);

		export_nodes.push_back(std::move(plan));
	}
	auto child_operator = UnionOperators(std::move(export_nodes));

	// try to create the directory, if it doesn't exist yet
	// a bit hacky to do it here, but we need to create the directory BEFORE the copy statements run
	if (!fs.DirectoryExists(stmt.info->file_path)) {
		fs.CreateDirectory(stmt.info->file_path);
	}

	stmt.info->catalog = catalog;
	// create the export node
	auto export_node =
	    make_uniq<LogicalExport>(copy_function.function, std::move(stmt.info), std::move(exported_tables));

	if (child_operator) {
		export_node->children.push_back(std::move(child_operator));
	}

	result.plan = std::move(export_node);

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::NOTHING;
	return result;
}